

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O0

void __thiscall
tchecker::zg::path::concrete::node_t::node_t
          (node_t *this,const_state_sptr_t *s,const_clockval_sptr_t *clockval,bool initial,
          bool final)

{
  bool bVar1;
  capacity_t_conflict cVar2;
  clockval_t *pcVar3;
  state_t *psVar4;
  zone_t *pzVar5;
  size_t sVar6;
  invalid_argument *piVar7;
  bool final_local;
  bool initial_local;
  const_clockval_sptr_t *clockval_local;
  const_state_sptr_t *s_local;
  node_t *this_local;
  
  symbolic::node_t::node_t(&this->super_node_t,s,initial,final);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::
  intrusive_shared_ptr_t(&this->_clockval,clockval);
  pcVar3 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
            ::operator->(&this->_clockval)->super_clockval_t;
  cVar2 = clockval_t::size(pcVar3);
  psVar4 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->(s)->super_state_t;
  pzVar5 = state_t::zone(psVar4);
  sVar6 = zone_t::dim(pzVar5);
  if (cVar2 != sVar6) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,"clock values and zone do not have the same size");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  psVar4 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
            ::operator->(s)->super_state_t;
  pzVar5 = state_t::zone(psVar4);
  pcVar3 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
            ::operator*(&this->_clockval)->super_clockval_t;
  bVar1 = zone_t::belongs(pzVar5,pcVar3);
  if (!bVar1) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"clock valuation does not belong to the zone");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

node_t::node_t(tchecker::zg::const_state_sptr_t const & s, tchecker::const_clockval_sptr_t const & clockval, bool initial,
               bool final)
    : tchecker::zg::path::symbolic::node_t(s, initial, final), _clockval(clockval)
{
  if (_clockval->size() != s->zone().dim())
    throw std::invalid_argument("clock values and zone do not have the same size");

  if (!s->zone().belongs(*_clockval))
    throw std::invalid_argument("clock valuation does not belong to the zone");
}